

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_connection.c
# Opt level: O0

apx_error_t apx_connection_create(apx_connection_t *self)

{
  undefined8 uVar1;
  clientRequirePortWriteFuncType1 *local_38;
  apx_clientEventListener_t listener;
  apx_connection_t *self_local;
  
  if (self == (apx_connection_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    listener.require_port_write1 = (clientRequirePortWriteFuncType1 *)self;
    uVar1 = apx_client_new();
    *(undefined8 *)listener.require_port_write1 = uVar1;
    if (*(long *)listener.require_port_write1 == 0) {
      self_local._4_4_ = 2;
    }
    else {
      memset(&local_38,0,0x20);
      local_38 = listener.require_port_write1;
      listener.arg = apx_connection_on_connect;
      listener.client_connect1 = apx_connection_on_disconnect;
      listener.client_disconnect1 = apx_connection_on_require_port_write;
      apx_client_register_event_listener(*(undefined8 *)listener.require_port_write1,&local_38);
      adt_hash_create(listener.require_port_write1 + 8,0);
      pthread_mutex_init((pthread_mutex_t *)(listener.require_port_write1 + 0x58),
                         (pthread_mutexattr_t *)0x0);
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_connection_create(apx_connection_t *self)
{
   if (self != 0)
   {
      apx_clientEventListener_t listener;
      self->client = apx_client_new();
      if (self->client == NULL)
      {
         return APX_MEM_ERROR;
      }
      memset(&listener, 0, sizeof(listener));
      listener.arg = (void*) self;
      listener.client_connect1 = apx_connection_on_connect;
      listener.client_disconnect1 = apx_connection_on_disconnect;
      listener.require_port_write1 = apx_connection_on_require_port_write;
      apx_client_register_event_listener(self->client, &listener);
      adt_hash_create(&self->provide_port_lookup_table, NULL);
      MUTEX_INIT(self->mutex);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}